

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

uint8_t calculate_next_resize_scale(AV1_COMP *cpi)

{
  RESIZE_MODE RVar1;
  int iVar2;
  uint32_t uVar3;
  AV1_COMP *in_RDI;
  uint8_t new_denom;
  ResizeCfg *resize_cfg;
  uint8_t local_19;
  uint8_t local_1;
  
  iVar2 = is_stat_generation_stage(in_RDI);
  if (iVar2 == 0) {
    local_19 = '\b';
    if (((in_RDI->common).seq_params)->reduced_still_picture_hdr == '\0') {
      RVar1 = (in_RDI->oxcf).resize_cfg.resize_mode;
      if (RVar1 == '\0') {
        local_19 = '\b';
      }
      else if (RVar1 == '\x01') {
        if ((in_RDI->common).current_frame.frame_type == '\0') {
          local_19 = (in_RDI->oxcf).resize_cfg.resize_kf_scale_denominator;
        }
        else {
          local_19 = (in_RDI->oxcf).resize_cfg.resize_scale_denominator;
        }
      }
      else if (RVar1 == '\x02') {
        uVar3 = lcg_rand16((uint32_t *)0x2ff521);
        local_19 = (char)((ulong)uVar3 % 9) + '\b';
      }
      local_1 = local_19;
    }
    else {
      local_1 = '\b';
    }
  }
  else {
    local_1 = '\b';
  }
  return local_1;
}

Assistant:

static uint8_t calculate_next_resize_scale(const AV1_COMP *cpi) {
  // Choose an arbitrary random number
  static unsigned int seed = 56789;
  const ResizeCfg *resize_cfg = &cpi->oxcf.resize_cfg;
  if (is_stat_generation_stage(cpi)) return SCALE_NUMERATOR;
  uint8_t new_denom = SCALE_NUMERATOR;

  if (cpi->common.seq_params->reduced_still_picture_hdr) return SCALE_NUMERATOR;
  switch (resize_cfg->resize_mode) {
    case RESIZE_NONE: new_denom = SCALE_NUMERATOR; break;
    case RESIZE_FIXED:
      if (cpi->common.current_frame.frame_type == KEY_FRAME)
        new_denom = resize_cfg->resize_kf_scale_denominator;
      else
        new_denom = resize_cfg->resize_scale_denominator;
      break;
    case RESIZE_RANDOM: new_denom = lcg_rand16(&seed) % 9 + 8; break;
    default: assert(0);
  }
  return new_denom;
}